

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  string v;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(value);
    this_local._7_1_ = true;
  }
  else {
    ::std::__cxx11::string::string((string *)local_48);
    this_local._7_1_ = ReadBasicType(this,(string *)local_48);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    }
    ::std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<std::string> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  std::string v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}